

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O2

wchar_t context_menu_object(object *obj)

{
  uint uVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  loc grid_03;
  _Bool _Var2;
  uchar uVar3;
  cmd_code cVar4;
  menu *m;
  char *pcVar5;
  square *psVar6;
  size_t sVar7;
  textblock *ptVar8;
  command_conflict *pcVar9;
  menu_row_validity_t mVar10;
  int iVar11;
  char *pcVar12;
  wchar_t mode;
  region r;
  char header [120];
  
  mode = (wchar_t)(player->opts).opt[1];
  m = menu_dynamic_new();
  if (obj == (object *)0x0 || m == (menu *)0x0) {
    return L'\0';
  }
  object_desc(header,0x78,obj,0x40,player);
  pcVar5 = string_make("abcdefghijklmnopqrstuvwxyz");
  m->selections = pcVar5;
  menu_dynamic_add_label(m,"Inspect",'I',0x45a,pcVar5);
  _Var2 = obj_can_browse(obj);
  if (_Var2) {
    _Var2 = obj_can_cast_from(obj);
    if ((_Var2) && (_Var2 = player_can_cast(player,false), _Var2)) {
      uVar3 = cmd_lookup_key_unktrl(CMD_CAST,mode);
      menu_dynamic_add_label_valid(m,"Cast",uVar3,0x1d,pcVar5,MN_ROW_VALID);
    }
    _Var2 = obj_can_study(obj);
    if ((_Var2) && (_Var2 = player_can_study(player,false), _Var2)) {
      uVar3 = cmd_lookup_key_unktrl(CMD_STUDY,mode);
      menu_dynamic_add_label_valid(m,"Study",uVar3,0x1c,pcVar5,MN_ROW_VALID);
    }
    _Var2 = player_can_read(player,false);
    if (_Var2) {
      iVar11 = 0x1b;
      uVar3 = cmd_lookup_key_unktrl(CMD_BROWSE_SPELL,mode);
      pcVar12 = "Browse";
      goto LAB_001b3085;
    }
  }
  else {
    _Var2 = obj_is_useable(obj);
    if (_Var2) {
      _Var2 = tval_is_wand(obj);
      if (_Var2) {
        _Var2 = obj_has_charges(obj);
        mVar10 = (menu_row_validity_t)_Var2;
        iVar11 = 0x1f;
        uVar3 = cmd_lookup_key_unktrl(CMD_USE_WAND,mode);
        pcVar12 = "Aim";
      }
      else {
        _Var2 = tval_is_rod(obj);
        if (_Var2) {
          _Var2 = obj_can_zap(obj);
          mVar10 = (menu_row_validity_t)_Var2;
          iVar11 = 0x20;
          uVar3 = cmd_lookup_key_unktrl(CMD_USE_ROD,mode);
          pcVar12 = "Zap";
        }
        else {
          _Var2 = tval_is_staff(obj);
          if (_Var2) {
            _Var2 = obj_has_charges(obj);
            mVar10 = (menu_row_validity_t)_Var2;
            iVar11 = 0x1e;
            uVar3 = cmd_lookup_key_unktrl(CMD_USE_STAFF,mode);
            pcVar12 = "Use";
          }
          else {
            _Var2 = tval_is_scroll(obj);
            if (_Var2) {
              _Var2 = player_can_read(player,false);
              mVar10 = (menu_row_validity_t)_Var2;
              iVar11 = 0x24;
              uVar3 = cmd_lookup_key_unktrl(CMD_READ_SCROLL,mode);
              pcVar12 = "Read";
            }
            else {
              _Var2 = tval_is_potion(obj);
              if (_Var2) {
                iVar11 = 0x23;
                uVar3 = cmd_lookup_key_unktrl(CMD_QUAFF,mode);
                pcVar12 = "Quaff";
              }
              else {
                _Var2 = tval_is_edible(obj);
                if (_Var2) {
                  iVar11 = 0x22;
                  uVar3 = cmd_lookup_key_unktrl(CMD_EAT,mode);
                  pcVar12 = "Eat";
                }
                else {
                  _Var2 = obj_is_activatable(obj);
                  if (_Var2) {
                    _Var2 = object_is_equipped(player->body,obj);
                    mVar10 = MN_ROW_INVALID;
                    if (_Var2) {
                      _Var2 = obj_can_activate(obj);
                      mVar10 = (menu_row_validity_t)_Var2;
                    }
                    iVar11 = 0x21;
                    uVar3 = cmd_lookup_key_unktrl(CMD_ACTIVATE,mode);
                    pcVar12 = "Activate";
                    goto LAB_001b317b;
                  }
                  _Var2 = obj_can_fire(obj);
                  if (_Var2) {
                    iVar11 = 0x27;
                    uVar3 = cmd_lookup_key_unktrl(CMD_FIRE,mode);
                    pcVar12 = "Fire";
                  }
                  else {
                    iVar11 = 0x26;
                    uVar3 = cmd_lookup_key_unktrl(CMD_USE,mode);
                    pcVar12 = "Use";
                  }
                }
              }
LAB_001b3085:
              mVar10 = MN_ROW_VALID;
            }
          }
        }
      }
LAB_001b317b:
      menu_dynamic_add_label_valid(m,pcVar12,uVar3,iVar11,pcVar5,mVar10);
    }
  }
  _Var2 = obj_can_refill(obj);
  if (_Var2) {
    uVar3 = cmd_lookup_key_unktrl(CMD_REFILL,mode);
    menu_dynamic_add_label_valid(m,"Refill",uVar3,0x25,pcVar5,MN_ROW_VALID);
  }
  _Var2 = object_is_equipped(player->body,obj);
  if ((_Var2) && (_Var2 = obj_can_takeoff(obj), _Var2)) {
    iVar11 = 0x18;
    uVar3 = cmd_lookup_key_unktrl(CMD_TAKEOFF,mode);
    pcVar12 = "Take off";
LAB_001b324a:
    menu_dynamic_add_label_valid(m,pcVar12,uVar3,iVar11,pcVar5,MN_ROW_VALID);
  }
  else {
    _Var2 = object_is_equipped(player->body,obj);
    if ((!_Var2) && (_Var2 = obj_can_wear(obj), _Var2)) {
      iVar11 = 0x19;
      uVar3 = cmd_lookup_key_unktrl(CMD_WIELD,mode);
      pcVar12 = "Equip";
      goto LAB_001b324a;
    }
  }
  _Var2 = object_is_carried(player,obj);
  if (_Var2) {
    grid.x = (player->grid).x;
    grid.y = (player->grid).y;
    _Var2 = square_isshop(cave,grid);
    if ((!_Var2) ||
       (grid_00.x = (player->grid).x, grid_00.y = (player->grid).y, psVar6 = square(cave,grid_00),
       psVar6->feat == '\x0e')) {
      uVar3 = cmd_lookup_key_unktrl(CMD_DROP,mode);
      menu_dynamic_add_label_valid(m,"Drop",uVar3,0x1a,pcVar5,MN_ROW_VALID);
      if (1 < obj->number) {
        menu_dynamic_add_label(m,"Drop All",(mode == L'\0') * '\x03' + 'A',0x45b,pcVar5);
      }
      goto LAB_001b333a;
    }
    _Var2 = store_will_buy_tester(obj);
    if (!_Var2) goto LAB_001b333a;
    iVar11 = 0x1a;
    uVar3 = cmd_lookup_key_unktrl(CMD_DROP,mode);
    pcVar12 = "Sell";
    mVar10 = MN_ROW_VALID;
  }
  else {
    _Var2 = inven_carry_okay(obj);
    iVar11 = 0x29;
    uVar3 = cmd_lookup_key_unktrl(CMD_PICKUP,mode);
    pcVar12 = "Pick up";
    mVar10 = (menu_row_validity_t)_Var2;
  }
  menu_dynamic_add_label_valid(m,pcVar12,uVar3,iVar11,pcVar5,mVar10);
LAB_001b333a:
  _Var2 = obj_can_throw(obj);
  if (_Var2) {
    uVar3 = cmd_lookup_key_unktrl(CMD_THROW,mode);
    menu_dynamic_add_label_valid(m,"Throw",uVar3,0x28,pcVar5,MN_ROW_VALID);
  }
  uVar3 = cmd_lookup_key_unktrl(CMD_INSCRIBE,mode);
  menu_dynamic_add_label_valid(m,"Inscribe",uVar3,0x15,pcVar5,MN_ROW_VALID);
  _Var2 = obj_has_inscrip(obj);
  if (_Var2) {
    uVar3 = cmd_lookup_key_unktrl(CMD_UNINSCRIBE,mode);
    menu_dynamic_add_label_valid(m,"Uninscribe",uVar3,0x16,pcVar5,MN_ROW_VALID);
  }
  uVar3 = cmd_lookup_key_unktrl(CMD_IGNORE,mode);
  _Var2 = object_is_ignored(obj);
  pcVar12 = "Ignore";
  if (_Var2) {
    pcVar12 = "Unignore";
  }
  menu_dynamic_add_label_valid(m,pcVar12,uVar3,0x2b,pcVar5,MN_ROW_VALID);
  sVar7 = menu_dynamic_longest_entry(m);
  iVar11 = (int)sVar7;
  r.width = iVar11 + 5;
  r.col = (Term->wid - iVar11) + -6;
  r.row = 1;
  r.page_rows = m->count;
  msg_flag = false;
  screen_save();
  ptVar8 = object_info(obj,OINFO_NONE);
  object_desc(header,0x78,obj,0x43,player);
  pcVar12 = format("%s");
  textui_textblock_place(ptVar8,(region_conflict)(ZEXT416(-iVar11 - 7U) << 0x40),pcVar12);
  textblock_free(ptVar8);
  menu_layout(m,&r);
  region_erase_bordered((region_conflict *)&r);
  pcVar12 = format("(Enter to select, ESC) Command for %s:");
  prt(pcVar12,L'\0',L'\0');
  cVar4 = menu_dynamic_select(m);
  menu_dynamic_free(m);
  string_free(pcVar5);
  screen_load();
  uVar3 = cmd_lookup_key(cVar4,mode);
  uVar1 = cVar4 + CMD_LOADFILE;
  if (uVar1 < 0x2d) {
    if ((0x17fffec00000U >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      _Var2 = key_confirm_command(uVar3);
      if (!_Var2) {
        return L'\x01';
      }
      _Var2 = get_item_allow(obj,uVar3,cVar4,false);
      if (!_Var2) {
        return L'\x01';
      }
      if (cVar4 == CMD_BROWSE_SPELL) {
        textui_book_browse(obj);
        return L'\x02';
      }
      if (cVar4 == CMD_STUDY) {
        cmdq_push(CMD_STUDY);
        pcVar9 = cmdq_peek();
        pcVar5 = "item";
      }
      else {
        if (cVar4 != CMD_CAST) {
          if (cVar4 == CMD_IGNORE) {
            textui_cmd_ignore_menu(obj);
            return L'\x01';
          }
          cmdq_push(cVar4);
          pcVar9 = cmdq_peek();
          cmd_set_arg_item(pcVar9,"item",obj);
          if (cVar4 != CMD_DROP) {
            return L'\x01';
          }
          grid_01.x = (player->grid).x;
          grid_01.y = (player->grid).y;
          _Var2 = square_isshop(cave,grid_01);
          if (!_Var2) {
            return L'\x01';
          }
          pcVar9 = cmdq_peek();
          grid_02.x = (player->grid).x;
          grid_02.y = (player->grid).y;
          psVar6 = square(cave,grid_02);
          if (psVar6->feat == '\x0e') {
            pcVar9->code = CMD_STASH;
            return L'\x01';
          }
          pcVar9->code = CMD_SELL;
          return L'\x01';
        }
        _Var2 = obj_can_cast_from(obj);
        if (!_Var2) {
          return L'\x01';
        }
        cmdq_push(CMD_CAST);
        pcVar9 = cmdq_peek();
        pcVar5 = "book";
      }
      cmd_set_arg_item(pcVar9,pcVar5,obj);
      return L'\x01';
    }
    if ((ulong)uVar1 == 0) {
      return L'\x03';
    }
  }
  if (cVar4 == 0x45b) {
    grid_03.x = (player->grid).x;
    grid_03.y = (player->grid).y;
    _Var2 = square_isshop(cave,grid_03);
    cVar4 = CMD_DROP;
    if (_Var2) {
      cVar4 = CMD_STASH;
    }
    cmdq_push(cVar4);
    pcVar9 = cmdq_peek();
    cmd_set_arg_item(pcVar9,"item",obj);
    pcVar9 = cmdq_peek();
    cmd_set_arg_number(pcVar9,"quantity",(uint)obj->number);
  }
  else {
    if (cVar4 == 0x45a) {
      ptVar8 = object_info(obj,OINFO_NONE);
      object_desc(header,0x78,obj,0x43,player);
      pcVar5 = format("%s");
      textui_textblock_show(ptVar8,(region_conflict)(ZEXT416(-iVar11 - 7U) << 0x40),pcVar5);
      textblock_free(ptVar8);
      return L'\x02';
    }
    bell();
  }
  return L'\x01';
}

Assistant:

int context_menu_object(struct object *obj)
{
	struct menu *m;
	region r;
	int selected;
	char *labels;
	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	bool allowed = true;
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;
	unsigned char cmdkey;

	m = menu_dynamic_new();
	if (!m || !obj)
		return 0;

	object_desc(header, sizeof(header), obj, ODESC_PREFIX | ODESC_BASE,
		player);

	labels = string_make(lower_case);
	m->selections = labels;

	/* 'I' is used for inspect in both keymaps. */
	menu_dynamic_add_label(m, "Inspect", 'I', MENU_VALUE_INSPECT, labels);

	if (obj_can_browse(obj)) {
		if (obj_can_cast_from(obj) && player_can_cast(player, false))
			ADD_LABEL("Cast", CMD_CAST, MN_ROW_VALID);

		if (obj_can_study(obj) && player_can_study(player, false))
			ADD_LABEL("Study", CMD_STUDY, MN_ROW_VALID);

		if (player_can_read(player, false))
			ADD_LABEL("Browse", CMD_BROWSE_SPELL, MN_ROW_VALID);
	} else if (obj_is_useable(obj)) {
		if (tval_is_wand(obj)) {
			menu_row_validity_t valid = (obj_has_charges(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Aim", CMD_USE_WAND, valid);
		} else if (tval_is_rod(obj)) {
			menu_row_validity_t valid = (obj_can_zap(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Zap", CMD_USE_ROD, valid);
		} else if (tval_is_staff(obj)) {
			menu_row_validity_t valid = (obj_has_charges(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Use", CMD_USE_STAFF, valid);
		} else if (tval_is_scroll(obj)) {
			menu_row_validity_t valid = (player_can_read(player, false)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Read", CMD_READ_SCROLL, valid);
		} else if (tval_is_potion(obj)) {
			ADD_LABEL("Quaff", CMD_QUAFF, MN_ROW_VALID);
		} else if (tval_is_edible(obj)) {
			ADD_LABEL("Eat", CMD_EAT, MN_ROW_VALID);
		} else if (obj_is_activatable(obj)) {
			menu_row_validity_t valid = (object_is_equipped(player->body, obj)
										 && obj_can_activate(obj)) ?
				MN_ROW_VALID : MN_ROW_INVALID;
			ADD_LABEL("Activate", CMD_ACTIVATE, valid);
		} else if (obj_can_fire(obj)) {
			ADD_LABEL("Fire", CMD_FIRE, MN_ROW_VALID);
		} else {
			ADD_LABEL("Use", CMD_USE, MN_ROW_VALID);
		}
	}

	if (obj_can_refill(obj))
		ADD_LABEL("Refill", CMD_REFILL, MN_ROW_VALID);

	if (object_is_equipped(player->body, obj) && obj_can_takeoff(obj)) {
		ADD_LABEL("Take off", CMD_TAKEOFF, MN_ROW_VALID);
	} else if (!object_is_equipped(player->body, obj) && obj_can_wear(obj)) {
		ADD_LABEL("Equip", CMD_WIELD, MN_ROW_VALID);
	}

	if (object_is_carried(player, obj)) {
		if (!square_isshop(cave, player->grid)) {
			ADD_LABEL("Drop", CMD_DROP, MN_ROW_VALID);

			if (obj->number > 1) {
				/* 'D' is used for ignore in rogue keymap, so swap letters. */
				cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'D' : 'A';
				menu_dynamic_add_label(m, "Drop All", cmdkey,
									   MENU_VALUE_DROP_ALL, labels);
			}
		} else if (square(cave, player->grid)->feat == FEAT_HOME) {
			ADD_LABEL("Drop", CMD_DROP, MN_ROW_VALID);

			if (obj->number > 1) {
				/* 'D' is used for ignore in rogue keymap, so swap letters. */
				cmdkey = (mode == KEYMAP_MODE_ORIG) ? 'D' : 'A';
				menu_dynamic_add_label(m, "Drop All", cmdkey,
									   MENU_VALUE_DROP_ALL, labels);
			}
		} else if (store_will_buy_tester(obj)) {
			ADD_LABEL("Sell", CMD_DROP, MN_ROW_VALID);
		}
	} else {
		menu_row_validity_t valid = (inven_carry_okay(obj)) ?
			MN_ROW_VALID : MN_ROW_INVALID;
		ADD_LABEL("Pick up", CMD_PICKUP, valid);
	}

	if (obj_can_throw(obj)) {
		ADD_LABEL("Throw", CMD_THROW, MN_ROW_VALID);
	}

	ADD_LABEL("Inscribe", CMD_INSCRIBE, MN_ROW_VALID);

	if (obj_has_inscrip(obj))
		ADD_LABEL("Uninscribe", CMD_UNINSCRIBE, MN_ROW_VALID);

	ADD_LABEL( (object_is_ignored(obj) ? "Unignore" : "Ignore"), CMD_IGNORE,
			   MN_ROW_VALID);

	/* work out display region */
	r.width = (int)menu_dynamic_longest_entry(m) + 3 + 2; /* +3 for tag,
														   * 2 for pad */
	r.col = Term->wid - r.width - 1;
	r.row = 1;
	r.page_rows = m->count;

	area.width = -(r.width + 2);

	/* Hack -- no flush needed */
	msg_flag = false;
	screen_save();

	/* Display info */
	tb = object_info(obj, OINFO_NONE);
	object_desc(header, sizeof(header), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	textui_textblock_place(tb, area, format("%s", header));
	textblock_free(tb);

	menu_layout(m, &r);
	region_erase_bordered(&r);

	prt(format("(Enter to select, ESC) Command for %s:", header), 0, 0);
	selected = menu_dynamic_select(m);

	menu_dynamic_free(m);
	string_free(labels);

	screen_load();

	cmdkey = cmd_lookup_key(selected, mode);

	switch (selected) {
		case -1:
			/* User cancelled the menu. */
			return 3;

		case MENU_VALUE_INSPECT:
			/* copied from textui_obj_examine */
			/* Display info */
			tb = object_info(obj, OINFO_NONE);
			object_desc(header, sizeof(header), obj,
				ODESC_PREFIX | ODESC_FULL, player);

			textui_textblock_show(tb, area, format("%s", header));
			textblock_free(tb);
			return 2;

		case MENU_VALUE_DROP_ALL:
			/* Drop entire stack without confirmation. */
			if (square_isshop(cave, player->grid))
				cmdq_push(CMD_STASH);
			else
				cmdq_push(CMD_DROP);
			cmd_set_arg_item(cmdq_peek(), "item", obj);
			cmd_set_arg_number(cmdq_peek(), "quantity", obj->number);
			return 1;

		case CMD_BROWSE_SPELL:
		case CMD_STUDY:
		case CMD_CAST:
		case CMD_IGNORE:
		case CMD_WIELD:
		case CMD_TAKEOFF:
		case CMD_INSCRIBE:
		case CMD_UNINSCRIBE:
		case CMD_PICKUP:
		case CMD_DROP:
		case CMD_REFILL:
		case CMD_THROW:
		case CMD_USE_WAND:
		case CMD_USE_ROD:
		case CMD_USE_STAFF:
		case CMD_READ_SCROLL:
		case CMD_QUAFF:
		case CMD_EAT:
		case CMD_ACTIVATE:
		case CMD_FIRE:
		case CMD_USE:
			/* Check for inscriptions that trigger confirmation. */
			allowed = key_confirm_command(cmdkey) &&
				get_item_allow(obj, cmdkey, selected, false);
			break;
		default:
			/* Invalid command; prevent anything from happening. */
			bell();
			allowed = false;
			break;
	}

	if (!allowed)
		return 1;

	if (selected == CMD_IGNORE) {
		/* ignore or unignore the item */
		textui_cmd_ignore_menu(obj);
	} else if (selected == CMD_BROWSE_SPELL) {
		/* browse a spellbook */
		/* copied from textui_spell_browse */
		textui_book_browse(obj);
		return 2;
	} else if (selected == CMD_STUDY) {
		cmdq_push(CMD_STUDY);
		cmd_set_arg_item(cmdq_peek(), "item", obj);
	} else if (selected == CMD_CAST) {
		if (obj_can_cast_from(obj)) {
			cmdq_push(CMD_CAST);
			cmd_set_arg_item(cmdq_peek(), "book", obj);
		}
	} else {
		cmdq_push(selected);
		cmd_set_arg_item(cmdq_peek(), "item", obj);

		/* If we're in a store, change the "drop" command to "stash". */
		if (selected == CMD_DROP &&
			square_isshop(cave, player->grid)) {
			struct command *gc = cmdq_peek();
			if (square(cave, player->grid)->feat == FEAT_HOME)
				gc->code = CMD_STASH;
			else
				gc->code = CMD_SELL;
		}
	}

	return 1;
}